

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O3

void __thiscall NEST::LArNEST::LArNEST(LArNEST *this,VDetector *detector)

{
  NESTcalc::NESTcalc(&this->super_NESTcalc,detector);
  (this->super_NESTcalc)._vptr_NESTcalc = (_func_int **)&PTR__LArNEST_0011cb58;
  this->fUseDokeBirks = false;
  this->fDensity = 1.393;
  this->fRIdealGas = 8.31446261815324;
  this->fRealGasA = 0.1355;
  this->fRealGasB = 3.201e-05;
  this->fTemperature = 85.0;
  this->fWorkQuantaFunction = 19.5;
  this->fWorkIonFunction = 23.6;
  this->fWorkPhotonFunction = 14.544;
  this->fNexOverNion = 0.21;
  this->fALF = 0.8264462809917356;
  this->fFanoER = 0.1115;
  (this->fNR).alpha = 11.1;
  (this->fNR).beta = 0.087;
  (this->fNR).gamma = 0.1;
  (this->fNR).delta = -0.0932;
  (this->fNR).epsilon = 2.998;
  (this->fNR).zeta = 0.3;
  (this->fNR).eta = 2.94;
  (this->fER).alpha.A = 32.988;
  (this->fER).alpha.B = -552.988;
  (this->fER).alpha.C = 17.2346;
  (this->fER).alpha.D = -4.7;
  (this->fER).alpha.E = 0.025115;
  (this->fER).alpha.F = 0.265360653;
  (this->fER).alpha.G = 0.242671;
  (this->fER).beta.A = 0.778482;
  (this->fER).beta.B = 25.9;
  (this->fER).beta.C = 1.105;
  (this->fER).beta.D = 0.4;
  (this->fER).beta.E = 4.55;
  (this->fER).beta.F = -7.502;
  (this->fER).gamma.A = 0.659509;
  (this->fER).gamma.B = 1000.0;
  (this->fER).gamma.C = 6.5;
  (this->fER).gamma.D = 5.0;
  (this->fER).gamma.E = -0.5;
  (this->fER).gamma.F = 1047.408;
  (this->fER).gamma.G = 0.01851;
  (this->fER).doke_birks.A = 1052.264;
  (this->fER).doke_birks.B = 14159348347.736;
  (this->fER).doke_birks.C = -5.0;
  (this->fER).doke_birks.D = 0.157933;
  (this->fER).doke_birks.E = 1.83894;
  (this->fER).p1 = 1.0;
  (this->fER).p2 = 10.304;
  (this->fER).p3 = 13.0654;
  (this->fER).p4 = 0.10535;
  (this->fER).p5 = 0.7;
  (this->fER).delta = 15.7489;
  (this->fER).let = -2.07763;
  (this->fAlpha).Ye.A = 0.00016129032258064516;
  (this->fAlpha).Ye.B = 64478398.7663;
  (this->fAlpha).Ye.C = 0.173553719;
  (this->fAlpha).Ye.D = 1.21;
  (this->fAlpha).Ye.E = 0.02852;
  (this->fAlpha).Ye.F = 0.01;
  (this->fAlpha).Ye.G = 4.71598;
  (this->fAlpha).Ye.H = 7.72848;
  (this->fAlpha).Ye.I = -0.109802;
  (this->fAlpha).Ye.J = 3.0;
  (this->fAlpha).Yph.A = 1.16;
  (this->fAlpha).Yph.B = -0.012;
  (this->fAlpha).Yph.C = 0.00015384615384615385;
  (this->fAlpha).Yph.D = 278037.250283;
  (this->fAlpha).Yph.E = 0.173553719;
  (this->fAlpha).Yph.F = 1.21;
  (this->fAlpha).Yph.G = 2.0;
  (this->fAlpha).Yph.H = 0.653503;
  (this->fAlpha).Yph.I = 4.98483;
  (this->fAlpha).Yph.J = 10.0822;
  (this->fAlpha).Yph.K = 1.2076;
  (this->fAlpha).Yph.L = -0.97977;
  (this->fAlpha).Yph.M = 3.0;
  (this->fThomasImelParameters).A = 0.1;
  (this->fThomasImelParameters).B = -0.0932;
  DriftParameters::DriftParameters(&this->fDriftParameters);
  return;
}

Assistant:

LArNEST::LArNEST(VDetector *detector) : NESTcalc(detector) {}